

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_find_last.c
# Opt level: O3

void * linkedlist_find_last(s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg)

{
  e_matcher_result eVar1;
  s_linkedlist_node *psVar2;
  
  psVar2 = (s_linkedlist_node *)&linked_list->tail;
  do {
    psVar2 = psVar2->previous;
    if (psVar2 == (s_linkedlist_node *)0x0) {
      return (void *)0x0;
    }
    eVar1 = (*matcher)(psVar2->element,matcher_arg);
  } while (eVar1 != E_MATCHER_RESULT_MATCH);
  return psVar2->element;
}

Assistant:

void *linkedlist_find_last(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg) {
    s_linkedlist_node *node = linked_list->tail;

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            return node->element;
        }

        node = node->previous;
    }

    return NULL;
}